

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecfactory.cpp
# Opt level: O1

shared_ptr<FastPForLib::IntegerCODEC> * __thiscall
FastPForLib::CODECFactory::getFromName(CODECFactory *this,string *name)

{
  const_iterator cVar1;
  _Base_ptr p_Var2;
  key_type local_38;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->scodecmap)._M_t._M_impl.super__Rb_tree_header) {
    getFromName();
    fwrite("for now, I\'m going to just return \'copy\'\n",0x29,1,_stderr);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"copy","");
    p_Var2 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
             ::at(&this->scodecmap,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  else {
    p_Var2 = cVar1._M_node + 2;
  }
  return (shared_ptr<FastPForLib::IntegerCODEC> *)p_Var2;
}

Assistant:

std::shared_ptr<IntegerCODEC> const& CODECFactory::getFromName(std::string name) const {
  auto it = scodecmap.find(name);
  if (it != scodecmap.end())
    return it->second;

  fprintf(stderr, "name %s does not refer to a CODEC.\n"
                  "possible choices:\n", name.c_str());
  for (auto i = scodecmap.begin(); i != scodecmap.end(); ++i) {
    fprintf(stderr, "%s\n", i->first.c_str());
  }
  fprintf(stderr, "for now, I'm going to just return 'copy'\n");
  return scodecmap.at("copy");
}